

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O2

pboolean p_dir_remove(pchar *path,PError **error)

{
  pboolean pVar1;
  int iVar2;
  PErrorIO code;
  pint pVar3;
  char *message;
  
  if (path == (pchar *)0x0) {
    message = "Invalid input argument";
    pVar3 = 0x1fb;
  }
  else {
    pVar1 = p_dir_is_exists(path);
    if (pVar1 != 0) {
      iVar2 = rmdir(path);
      if (iVar2 == 0) {
        return 1;
      }
      code = p_error_get_last_io();
      pVar3 = p_error_get_last_system();
      p_error_set_error_p(error,code,pVar3,"Failed to call rmdir() to remove directory");
      return 0;
    }
    message = "Specified directory doesn\'t exist";
    pVar3 = 0x207;
  }
  p_error_set_error_p(error,pVar3,0,message);
  return 0;
}

Assistant:

P_LIB_API pboolean
p_dir_remove (const pchar	*path,
	      PError		**error)
{
	if (P_UNLIKELY (path == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (!p_dir_is_exists (path)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NOT_EXISTS,
				     0,
				     "Specified directory doesn't exist");
		return FALSE;
	}

	if (P_UNLIKELY (rmdir (path) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call rmdir() to remove directory");
		return FALSE;
	} else
		return TRUE;
}